

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_tst_pcdi_32(m68k_info *info)

{
  long in_RDI;
  
  if ((*(uint *)(in_RDI + 0x28) & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x3a203d);
  }
  else {
    build_ea(info,(int)((ulong)in_RDI >> 0x20),(uint8_t)((ulong)in_RDI >> 0x18));
  }
  return;
}

Assistant:

static void d68020_tst_pcdi_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_ea(info, M68K_INS_TST, 4);
}